

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationX.hpp
# Opt level: O0

RotationX<std::complex<float>_> * __thiscall
qclab::qgates::RotationX<std::complex<float>_>::operator/=
          (RotationX<std::complex<float>_> *this,RotationX<std::complex<float>_> *rhs)

{
  int iVar1;
  int iVar2;
  rotation_type *rhs_00;
  RotationX<std::complex<float>_> *rhs_local;
  RotationX<std::complex<float>_> *this_local;
  
  iVar1 = (*(this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])();
  iVar2 = (*(rhs->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])();
  if (iVar1 == iVar2) {
    rhs_00 = QRotationGate1<std::complex<float>_>::rotation
                       (&rhs->super_QRotationGate1<std::complex<float>_>);
    QRotation<float>::operator/=
              (&(this->super_QRotationGate1<std::complex<float>_>).rotation_,rhs_00);
    return this;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationX.hpp"
                ,0xaa,
                "RotationX<T> &qclab::qgates::RotationX<std::complex<float>>::operator/=(const RotationX<T> &) [T = std::complex<float>]"
               );
}

Assistant:

inline RotationX< T >& operator/=( const RotationX< T >& rhs ) {
          assert( this->qubit() == rhs.qubit() ) ;
          this->rotation_ /= rhs.rotation() ;
          return *this ;
        }